

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O3

int mem_write(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  ulong uVar5;
  ulong __n;
  ulong uVar6;
  
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x4c1,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
  }
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_write(%p, %p, %u)\n",obj,buf,(ulong)cnt);
  }
  uVar5 = *(ulong *)((long)obj + 8);
  uVar4 = *(ulong *)((long)obj + 0x18);
  uVar6 = (ulong)cnt;
  if ((uVar5 < uVar4 + uVar6) && (uVar3 = uVar5, *(int *)((long)obj + 0x20) != 0)) {
    do {
      if ((long)uVar3 < 0) {
        if (iVar1 < 100) {
          return -1;
        }
        fmt = "new buffer size would cause overflow\n";
        goto LAB_00114090;
      }
      uVar3 = uVar3 * 2;
    } while (uVar3 < uVar4 + uVar6);
    if (iVar1 < 100) {
      pvVar2 = jas_realloc2(*obj,uVar3,1);
      if (pvVar2 == (void *)0x0) {
        return -1;
      }
    }
    else {
      jas_eprintf("mem_write resizing from %d to %zu\n",uVar5,uVar3);
      jas_eprintf("mem_resize(%p, %zu)\n",obj,uVar3);
      pvVar2 = jas_realloc2(*obj,uVar3,1);
      if (pvVar2 == (void *)0x0) {
        fmt = "mem_resize realloc failed\n";
LAB_00114090:
        jas_eprintf(fmt);
        return -1;
      }
      jas_eprintf("mem_resize realloc succeeded\n");
    }
    *(void **)obj = pvVar2;
    *(ulong *)((long)obj + 8) = uVar3;
    uVar4 = *(ulong *)((long)obj + 0x18);
    uVar5 = uVar3;
  }
  uVar3 = *(ulong *)((long)obj + 0x10);
  if (uVar3 < uVar4) {
    if (uVar5 != uVar3) {
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      memset((void *)(uVar3 + *obj),0,uVar5 - uVar3);
      uVar5 = (uVar5 - uVar3) + *(long *)((long)obj + 0x10);
      *(ulong *)((long)obj + 0x10) = uVar5;
      uVar4 = *(ulong *)((long)obj + 0x18);
    }
    uVar3 = uVar5;
    if (uVar4 != uVar3) {
      return 0;
    }
    uVar5 = *(ulong *)((long)obj + 8);
    uVar4 = uVar3;
  }
  __n = uVar5 - uVar4;
  if (uVar6 <= uVar5 - uVar4) {
    __n = uVar6;
  }
  if (__n != 0) {
    memcpy((void *)(uVar4 + *obj),buf,__n);
    uVar4 = *(long *)((long)obj + 0x18) + __n;
    *(ulong *)((long)obj + 0x18) = uVar4;
    uVar3 = *(ulong *)((long)obj + 0x10);
  }
  if (uVar3 < uVar4) {
    *(ulong *)((long)obj + 0x10) = uVar4;
  }
  if ((uint)__n != cnt) {
    __assert_fail("ret == cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x4eb,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
  }
  return cnt;
}

Assistant:

static int mem_write(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	size_t n;
	jas_stream_memobj_t *m = (jas_stream_memobj_t *)obj;
	size_t newbufsize;
	size_t newpos;

	assert(buf);

	JAS_DBGLOG(100, ("mem_write(%p, %p, %u)\n", obj, buf, cnt));
	newpos = m->pos_ + cnt;
	if (newpos > m->bufsize_ && m->growable_) {
		newbufsize = m->bufsize_;
		while (newbufsize < newpos) {
			//newbufsize <<= 1;
			if (!jas_safe_size_mul(newbufsize, 2, &newbufsize)) {
				JAS_DBGLOG(100, ("new buffer size would cause overflow\n"));
				return -1;
			}
		}
		JAS_DBGLOG(100, ("mem_write resizing from %d to %zu\n", m->bufsize_,
		  newbufsize));
		assert(newbufsize > 0);
		if (mem_resize(m, newbufsize)) {
			return -1;
		}
	}
	if (m->pos_ > m->len_) {
		/* The current position is beyond the end of the file, so
		  pad the file to the current position with zeros. */
		n = JAS_MIN(m->pos_, m->bufsize_) - m->len_;
		if (n > 0) {
			memset(&m->buf_[m->len_], 0, n);
			m->len_ += n;
		}
		if (m->pos_ != m->len_) {
			/* The buffer is not big enough. */
			return 0;
		}
	}
	n = m->bufsize_ - m->pos_;
	unsigned ret = JAS_MIN(n, cnt);
	if (ret > 0) {
		memcpy(&m->buf_[m->pos_], buf, ret);
		m->pos_ += ret;
	}
	if (m->pos_ > m->len_) {
		m->len_ = m->pos_;
	}
	assert(ret == cnt);
	return ret;
}